

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O1

void __thiscall crn::corpus_gen::sort_blocks(corpus_gen *this,image_u8 *img)

{
  uchar uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  double dVar4;
  uint min_new_capacity;
  uint *puVar6;
  uint x_1;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uchar *puVar14;
  long lVar15;
  uint x;
  long lVar16;
  uint y;
  uint uVar17;
  int iVar18;
  uint x_2;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  vector<unsigned_int> remaining_blocks;
  int local_13c;
  ulong local_128;
  double local_120;
  vector<unsigned_int> block_indices1;
  vector<unsigned_int> block_indices0;
  vector<float> block_std_dev;
  image_u8 new_img;
  color_quad_u8 c [16];
  ulong uVar5;
  
  uVar2 = img->m_width;
  uVar10 = img->m_height;
  min_new_capacity = uVar2 >> 2;
  uVar5 = (ulong)min_new_capacity;
  uVar7 = (ulong)(uVar10 >> 2);
  uVar21 = (uVar10 >> 2) * min_new_capacity;
  crnlib::console::printf("Sorting %u blocks...",(ulong)uVar21);
  block_std_dev.m_p = (float *)0x0;
  block_std_dev.m_size = 0;
  block_std_dev.m_capacity = 0;
  if (uVar21 != 0) {
    crnlib::elemental_vector::increase_capacity
              ((elemental_vector *)&block_std_dev,uVar21,uVar21 == 1,4,(object_mover)0x0,false);
    memset(block_std_dev.m_p + (block_std_dev._8_8_ & 0xffffffff),0,
           (ulong)(uVar21 - block_std_dev.m_size) << 2);
    block_std_dev.m_size = uVar21;
  }
  if (3 < uVar10) {
    iVar24 = 0;
    local_128 = 0;
    do {
      if (3 < uVar2) {
        iVar20 = 0;
        uVar22 = 0;
        do {
          pcVar3 = img->m_pPixels;
          uVar11 = img->m_pitch;
          iVar9 = iVar24 * uVar11 + iVar20;
          puVar14 = &c[0].field_0.field_0.a;
          lVar15 = 0;
          do {
            lVar16 = 0;
            do {
              uVar17 = iVar9 + (int)lVar16;
              puVar14[lVar16 * 4 + -3] = pcVar3[uVar17].field_0.field_0.r;
              puVar14[lVar16 * 4 + -2] = pcVar3[uVar17].field_0.field_0.g;
              puVar14[lVar16 * 4 + -1] = pcVar3[uVar17].field_0.field_0.b;
              puVar14[lVar16 * 4] = pcVar3[uVar17].field_0.field_0.a;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            lVar15 = lVar15 + 1;
            iVar9 = iVar9 + uVar11;
            puVar14 = puVar14 + 0x10;
          } while (lVar15 != 4);
          uVar11 = 0;
          local_120 = 0.0;
          do {
            dVar4 = crnlib::image_utils::compute_std_dev(0x10,c,uVar11,1);
            local_120 = local_120 + dVar4;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 3);
          block_std_dev.m_p[min_new_capacity * (int)local_128 + (int)uVar22] = (float)local_120;
          uVar22 = uVar22 + 1;
          iVar20 = iVar20 + 4;
        } while (uVar22 != uVar5);
      }
      local_128 = local_128 + 1;
      iVar24 = iVar24 + 4;
    } while (local_128 != uVar7);
  }
  block_indices0.m_p = (uint *)0x0;
  block_indices0.m_size = 0;
  block_indices0.m_capacity = 0;
  if (uVar21 == 0) {
    block_indices1.m_p = (uint *)0x0;
    block_indices1.m_size = 0;
    block_indices1.m_capacity = 0;
  }
  else {
    crnlib::elemental_vector::increase_capacity
              ((elemental_vector *)&block_indices0,uVar21,uVar21 == 1,4,(object_mover)0x0,false);
    memset(block_indices0.m_p + (block_indices0._8_8_ & 0xffffffff),0,
           (ulong)(uVar21 - block_indices0.m_size) << 2);
    block_indices0.m_size = uVar21;
    block_indices1.m_p = (uint *)0x0;
    block_indices1.m_size = 0;
    block_indices1.m_capacity = 0;
    if (uVar21 != 0) {
      crnlib::elemental_vector::increase_capacity
                ((elemental_vector *)&block_indices1,uVar21,uVar21 == 1,4,(object_mover)0x0,false);
      memset(block_indices1.m_p + (block_indices1._8_8_ & 0xffffffff),0,
             (ulong)(uVar21 - block_indices1.m_size) << 2);
      block_indices1.m_size = uVar21;
    }
  }
  puVar6 = crnlib::indirect_radix_sort<unsigned_int,float>
                     (uVar21,block_indices0.m_p,block_indices1.m_p,block_std_dev.m_p,0,4,true);
  c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0xff000000;
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
            (&new_img,img->m_width,img->m_height,0xffffffff,c,0xf);
  if (uVar21 != 0) {
    uVar22 = 0;
    do {
      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
                (&new_img,puVar6[uVar22] % min_new_capacity << 2,
                 puVar6[uVar22] / min_new_capacity << 2,4,4,(int)((uVar22 & 0xffffffff) % uVar5) * 4
                 ,(int)((uVar22 & 0xffffffff) / uVar5) << 2,img);
      uVar22 = uVar22 + 1;
    } while (uVar21 != uVar22);
  }
  remaining_blocks.m_p = (uint *)0x0;
  remaining_blocks.m_size = 0;
  remaining_blocks.m_capacity = 0;
  if (3 < uVar2) {
    crnlib::elemental_vector::increase_capacity
              ((elemental_vector *)&remaining_blocks,min_new_capacity,min_new_capacity == 1,4,
               (object_mover)0x0,false);
    memset(remaining_blocks.m_p + (remaining_blocks._8_8_ & 0xffffffff),0,
           (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
    remaining_blocks.m_size = min_new_capacity;
  }
  crnlib::console::printf("Arranging %u blocks...");
  if (3 < uVar10) {
    local_13c = 0;
    uVar22 = 0;
    do {
      crnlib::console::printf("%u of %u",uVar22,uVar7);
      if (remaining_blocks.m_size != min_new_capacity) {
        if (remaining_blocks.m_size <= min_new_capacity) {
          if (remaining_blocks.m_capacity < min_new_capacity) {
            crnlib::elemental_vector::increase_capacity
                      ((elemental_vector *)&remaining_blocks,min_new_capacity,
                       remaining_blocks.m_size + 1 == min_new_capacity,4,(object_mover)0x0,false);
          }
          memset(remaining_blocks.m_p + (remaining_blocks._8_8_ & 0xffffffff),0,
                 (ulong)(min_new_capacity - remaining_blocks.m_size) << 2);
        }
        remaining_blocks.m_size = min_new_capacity;
      }
      if (3 < uVar2) {
        uVar8 = 0;
        do {
          remaining_blocks.m_p[uVar8] = (uint)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      c[0xc].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xd].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xe].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xf].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[8].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[9].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[10].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0xb].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[4].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[5].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[6].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[7].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[2].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      c[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
      if (3 < uVar2) {
        iVar24 = 0;
        uVar8 = 0;
        do {
          if ((remaining_blocks._8_8_ & 0xffffffff) == 0) {
            uVar10 = 0;
          }
          else {
            uVar19 = 0;
            uVar23 = 0xffffffffffffffff;
            uVar10 = 0;
            do {
              iVar20 = local_13c * new_img.m_pitch + remaining_blocks.m_p[uVar19] * 4;
              puVar14 = &c[0].field_0.field_0.b;
              lVar15 = 0;
              uVar12 = 0;
              do {
                lVar16 = 0;
                do {
                  uVar21 = iVar20 + (int)lVar16;
                  iVar9 = (uint)new_img.m_pPixels[uVar21].field_0.field_0.r -
                          (uint)puVar14[lVar16 * 4 + -2];
                  iVar18 = (uint)new_img.m_pPixels[uVar21].field_0.field_0.g -
                           (uint)puVar14[lVar16 * 4 + -1];
                  iVar13 = (uint)new_img.m_pPixels[uVar21].field_0.field_0.b -
                           (uint)puVar14[lVar16 * 4];
                  uVar12 = uVar12 + (uint)(iVar13 * iVar13 + iVar18 * iVar18 + iVar9 * iVar9);
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 4);
                lVar15 = lVar15 + 1;
                iVar20 = iVar20 + new_img.m_pitch;
                puVar14 = puVar14 + 0x10;
              } while (lVar15 != 4);
              if (uVar12 < uVar23) {
                uVar23 = uVar12;
                uVar10 = (uint)uVar19;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != (remaining_blocks._8_8_ & 0xffffffff));
          }
          uVar21 = remaining_blocks.m_p[uVar10];
          puVar14 = &c[0].field_0.field_0.a;
          lVar15 = 0;
          iVar20 = local_13c;
          do {
            lVar16 = 0;
            do {
              uVar17 = new_img.m_pitch * iVar20 + uVar21 * 4 + (int)lVar16;
              uVar1 = new_img.m_pPixels[uVar17].field_0.field_0.r;
              puVar14[lVar16 * 4 + -3] = uVar1;
              puVar14[lVar16 * 4 + -2] = new_img.m_pPixels[uVar17].field_0.field_0.g;
              puVar14[lVar16 * 4 + -1] = new_img.m_pPixels[uVar17].field_0.field_0.b;
              puVar14[lVar16 * 4] = new_img.m_pPixels[uVar17].field_0.field_0.a;
              pcVar3 = img->m_pPixels;
              uVar25 = img->m_pitch * iVar20 + iVar24 + (int)lVar16;
              pcVar3[uVar25].field_0.field_0.r = uVar1;
              pcVar3[uVar25].field_0.field_0.g = new_img.m_pPixels[uVar17].field_0.field_0.g;
              pcVar3[uVar25].field_0.field_0.b = new_img.m_pPixels[uVar17].field_0.field_0.b;
              pcVar3[uVar25].field_0.field_0.a = new_img.m_pPixels[uVar17].field_0.field_0.a;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            lVar15 = lVar15 + 1;
            iVar20 = iVar20 + 1;
            puVar14 = puVar14 + 0x10;
          } while (lVar15 != 4);
          if (uVar10 + 1 < remaining_blocks.m_size) {
            remaining_blocks.m_p[uVar10] = remaining_blocks.m_p[remaining_blocks.m_size - 1];
          }
          if (remaining_blocks.m_size != 0) {
            remaining_blocks.m_size = remaining_blocks.m_size - 1;
          }
          uVar8 = uVar8 + 1;
          iVar24 = iVar24 + 4;
        } while (uVar8 != uVar5);
      }
      uVar22 = uVar22 + 1;
      local_13c = local_13c + 4;
    } while (uVar22 != uVar7);
  }
  if (remaining_blocks.m_p != (uint *)0x0) {
    crnlib::crnlib_free(remaining_blocks.m_p);
  }
  if (new_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib::crnlib_free(new_img.m_pixel_buf.m_p);
  }
  if (block_indices1.m_p != (uint *)0x0) {
    crnlib::crnlib_free(block_indices1.m_p);
  }
  if (block_indices0.m_p != (uint *)0x0) {
    crnlib::crnlib_free(block_indices0.m_p);
  }
  if (block_std_dev.m_p != (float *)0x0) {
    crnlib::crnlib_free(block_std_dev.m_p);
  }
  return;
}

Assistant:

void corpus_gen::sort_blocks(image_u8& img)
    {
        const uint num_blocks_x = img.get_width() / 4;
        const uint num_blocks_y = img.get_height() / 4;
        const uint total_blocks = num_blocks_x * num_blocks_y;

        console::printf("Sorting %u blocks...", total_blocks);

        crnlib::vector<float> block_std_dev(total_blocks);

        for (uint by = 0; by < num_blocks_y; by++)
        {
            for (uint bx = 0; bx < num_blocks_x; bx++)
            {
                color_quad_u8 c[4 * 4];

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        c[x + y * 4] = img(bx * 4 + x, by * 4 + y);
                    }
                }

                double std_dev = 0.0f;
                for (uint i = 0; i < 3; i++)
                {
                    std_dev += image_utils::compute_std_dev(16, c, i, 1);
                }

                block_std_dev[bx + by * num_blocks_x] = (float)std_dev;
            }
        }

        crnlib::vector<uint> block_indices0(total_blocks);
        crnlib::vector<uint> block_indices1(total_blocks);

        const uint* pIndices = indirect_radix_sort(total_blocks, &block_indices0[0], &block_indices1[0], &block_std_dev[0], 0, sizeof(float), true);

        image_u8 new_img(img.get_width(), img.get_height());

        uint dst_block_index = 0;

        //float prev_std_dev = -999;
        for (uint i = 0; i < total_blocks; i++)
        {
            uint src_block_index = pIndices[i];

            //float std_dev = block_std_dev[src_block_index];
            //crnlib_ASSERT(std_dev >= prev_std_dev);
            //prev_std_dev = std_dev;

            uint src_block_x = src_block_index % num_blocks_x;
            uint src_block_y = src_block_index / num_blocks_x;

            uint dst_block_x = dst_block_index % num_blocks_x;
            uint dst_block_y = dst_block_index / num_blocks_x;

            new_img.unclipped_blit(src_block_x * 4, src_block_y * 4, 4, 4, dst_block_x * 4, dst_block_y * 4, img);

            dst_block_index++;
        }

#if 0
        //new_img.swap(img);
#else
        crnlib::vector<uint> remaining_blocks(num_blocks_x);

        console::printf("Arranging %u blocks...", total_blocks);

        for (uint by = 0; by < num_blocks_y; by++)
        {
            console::printf("%u of %u", by, num_blocks_y);

            remaining_blocks.resize(num_blocks_x);
            for (uint i = 0; i < num_blocks_x; i++)
            {
                remaining_blocks[i] = i;
            }

            color_quad_u8 match_block[16];
            utils::zero_object(match_block);
            for (uint bx = 0; bx < num_blocks_x; bx++)
            {
                uint best_index = 0;

                uint64 best_error = cUINT64_MAX;

                for (uint i = 0; i < remaining_blocks.size(); i++)
                {
                    uint src_block_index = remaining_blocks[i];

                    uint64 error = 0;
                    for (uint y = 0; y < 4; y++)
                    {
                        for (uint x = 0; x < 4; x++)
                        {
                            const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
                            error += color::elucidian_distance(c, match_block[x + y * 4], false);
                        }
                    }

                    if (error < best_error)
                    {
                        best_error = error;
                        best_index = i;
                    }
                }

                uint src_block_index = remaining_blocks[best_index];

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
                        match_block[x + y * 4] = c;

                        img(bx * 4 + x, by * 4 + y) = c;
                    }
                }

                remaining_blocks.erase_unordered(best_index);
            }
        }
#endif
    }